

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

void chain::str::split_for_each<(chain::str::case_t)0,____C_A_T_C_H____T_E_S_T____28()::__0>
               (string_view data,string_view delim,anon_class_8_1_4f9d58bb *functor)

{
  string_view needle;
  string_view haystack;
  size_type sVar1;
  size_t sVar2;
  bool bVar3;
  size_type sVar4;
  const_pointer pvVar5;
  string_view local_88;
  string_view local_78;
  anon_class_8_1_4f9d58bb *local_68;
  size_t local_60;
  char *local_58;
  char *local_50;
  size_type local_48;
  size_t next;
  size_t start;
  size_t length;
  anon_class_8_1_4f9d58bb *functor_local;
  string_view delim_local;
  string_view data_local;
  
  delim_local._M_str = (char *)data._M_len;
  delim_local._M_len = (size_t)delim._M_str;
  functor_local = (anon_class_8_1_4f9d58bb *)delim._M_len;
  next = 0;
  length = (size_t)functor;
  while( true ) {
    local_58 = delim_local._M_str;
    local_68 = functor_local;
    local_60 = delim_local._M_len;
    haystack._M_str = data._M_str;
    haystack._M_len = (size_t)delim_local._M_str;
    needle._M_str = (char *)delim_local._M_len;
    needle._M_len = (size_t)functor_local;
    local_50 = data._M_str;
    local_48 = find<(chain::str::case_t)0>(haystack,needle,next);
    sVar2 = length;
    if (local_48 == 0xffffffffffffffff) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local._M_str);
      sVar2 = length;
      start = sVar4 - next;
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local._M_str);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,pvVar5 + next,start);
      ____C_A_T_C_H____T_E_S_T____28::anon_class_8_1_4f9d58bb::operator()
                ((anon_class_8_1_4f9d58bb *)sVar2,local_78);
      return;
    }
    start = local_48 - next;
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delim_local._M_str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_88,pvVar5 + next,start);
    bVar3 = ____C_A_T_C_H____T_E_S_T____28::anon_class_8_1_4f9d58bb::operator()
                      ((anon_class_8_1_4f9d58bb *)sVar2,local_88);
    sVar1 = local_48;
    if (!bVar3) break;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&functor_local);
    next = sVar1 + sVar4;
  }
  return;
}

Assistant:

auto split_for_each(std::string_view data, std::string_view delim, functor_type&& functor) -> void
{
    std::size_t length;
    std::size_t start = 0;

    while (true)
    {
        std::size_t next = find<case_type>(data, delim, start);
        if (next == std::string_view::npos)
        {
            // The length of this split is the full string length - start.
            // This is also true if there were no delimiters found at all.
            length = data.length() - start;
            functor(std::string_view{data.data() + start, length});
            break;
        }

        // The length of this split is from start to next.
        length = next - start;

        if constexpr (std::is_same_v<std::invoke_result_t<functor_type, std::string_view>, bool>)
        {
            // Call the users functor for this token part, if they return false stop parsing.
            if (!functor(std::string_view{data.data() + start, length}))
            {
                break;
            }
        }
        else
        {
            functor(std::string_view{data.data() + start, length});
        }

        // Update our iteration to skip the 'next' delimiter found.
        start = next + delim.length();
    }
}